

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

RandomUniformStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_randomuniformstatic
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  RandomUniformStaticLayerParams *pRVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x4ab) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4ab;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pRVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::RandomUniformStaticLayerParams>(arena);
    (this->layer_).randomuniformstatic_ = pRVar2;
  }
  return (RandomUniformStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomUniformStaticLayerParams* NeuralNetworkLayer::_internal_mutable_randomuniformstatic() {
  if (!_internal_has_randomuniformstatic()) {
    clear_layer();
    set_has_randomuniformstatic();
    layer_.randomuniformstatic_ = CreateMaybeMessage< ::CoreML::Specification::RandomUniformStaticLayerParams >(GetArenaForAllocation());
  }
  return layer_.randomuniformstatic_;
}